

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbrtInfo.cpp
# Opt level: O2

void __thiscall pbrt::semantic::PBRTInfo::Counter::print(Counter *this,string *name)

{
  ostream *poVar1;
  size_t s;
  size_t s_00;
  string sStack_38;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"number of ");
  poVar1 = std::operator<<(poVar1,(string *)name);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout," - unique    : ");
  math::prettyNumber_abi_cxx11_(&sStack_38,(math *)this->unique,s);
  poVar1 = std::operator<<(poVar1,(string *)&sStack_38);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&sStack_38);
  poVar1 = std::operator<<((ostream *)&std::cout," - instanced : ");
  math::prettyNumber_abi_cxx11_(&sStack_38,(math *)this->instanced,s_00);
  poVar1 = std::operator<<(poVar1,(string *)&sStack_38);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&sStack_38);
  return;
}

Assistant:

void print(const std::string &name)
        {
          std::cout << "number of " << name << std::endl;
          std::cout << " - unique    : " << math::prettyNumber(unique) << std::endl;
          std::cout << " - instanced : " << math::prettyNumber(instanced) << std::endl;
        }